

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-x86_64.c
# Opt level: O0

uint8_t * push_insns(VARR_uint8_t *insn_varr,uint8_t *pat,size_t pat_len)

{
  uint8_t *puVar1;
  size_t sVar2;
  ulong local_28;
  size_t i;
  size_t pat_len_local;
  uint8_t *pat_local;
  VARR_uint8_t *insn_varr_local;
  
  for (local_28 = 0; local_28 < pat_len; local_28 = local_28 + 1) {
    VARR_uint8_tpush(insn_varr,pat[local_28]);
  }
  puVar1 = VARR_uint8_taddr(insn_varr);
  sVar2 = VARR_uint8_tlength(insn_varr);
  return puVar1 + (sVar2 - pat_len);
}

Assistant:

static uint8_t *push_insns (VARR (uint8_t) * insn_varr, const uint8_t *pat, size_t pat_len) {
  for (size_t i = 0; i < pat_len; i++) VARR_PUSH (uint8_t, insn_varr, pat[i]);
  return VARR_ADDR (uint8_t, insn_varr) + VARR_LENGTH (uint8_t, insn_varr) - pat_len;
}